

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadraticCube>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZQuadraticCube> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *in_RDX;
  TPZRegisterClassId *in_RDI;
  TPZRegisterClassId *this_00;
  int side;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int n;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000002c0
  ;
  TPZGeoEl *in_stack_000002c8;
  TPZGeoMesh *in_stack_000002d0;
  void **in_stack_000002d8;
  TPZGeoEl *in_stack_000002e0;
  TPZGeoElSide *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZGeoElSide *in_stack_fffffffffffffef8;
  iterator in_stack_ffffffffffffff00;
  TPZQuadraticCube *in_stack_ffffffffffffff08;
  TPZGeoElSideIndex *index;
  TPZQuadraticCube *in_stack_ffffffffffffff10;
  TPZGeoElSide *this_01;
  TPZGeoElSide *__k;
  TPZGeoElSideIndex local_b8 [2];
  _Self local_88;
  _Self local_80;
  int local_74;
  int64_t local_70;
  TPZGeoElSide local_68;
  undefined4 local_4c;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  TPZGeoEl *local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZQuadraticCube>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_02462ec8);
  TPZGeoEl::TPZGeoEl(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                     in_stack_000002c0);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02462bb0;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_02462bb0;
  this_00 = in_RDI + 0x40;
  pzgeom::TPZQuadraticCube::TPZQuadraticCube
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
             (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             in_stack_ffffffffffffff00._M_node);
  __k = (TPZGeoElSide *)(in_RDI + 0xe8);
  do {
    this_01 = __k;
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    __k = this_01 + 1;
  } while (__k != (TPZGeoElSide *)(in_RDI + 0x370));
  local_4c = 0x1b;
  for (local_48 = 0; local_48 < 0x1b; local_48 = local_48 + 1) {
    index = (TPZGeoElSideIndex *)(&local_18[3].fFatherIndex + (long)local_48 * 3);
    TPZGeoEl::Mesh(local_18);
    TPZGeoElSide::TPZGeoElSide(this_01,index,(TPZGeoMesh *)in_stack_ffffffffffffff00._M_node);
    pTVar2 = TPZGeoElSide::Element(&local_68);
    local_70 = TPZGeoEl::Index(pTVar2);
    local_74 = TPZGeoElSide::Side(&local_68);
    while( true ) {
      in_stack_ffffffffffffff00 =
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                in_stack_fffffffffffffee8,(key_type_conflict1 *)0x175c1dc);
      local_80._M_node = in_stack_ffffffffffffff00._M_node;
      local_88._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                       *)in_stack_fffffffffffffee8);
      bVar1 = std::operator==(&local_80,&local_88);
      if (!bVar1) break;
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffef8);
      TPZGeoElSide::operator=
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x175c253);
      pTVar2 = TPZGeoElSide::Element(&local_68);
      local_70 = TPZGeoEl::Index(pTVar2);
      local_74 = TPZGeoElSide::Side(&local_68);
    }
    in_stack_fffffffffffffef8 =
         (TPZGeoElSide *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)this_00,(key_type_conflict1 *)__k);
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)in_stack_ffffffffffffff00._M_node,
               (int64_t)in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_48 * 0x18 + 0xe8),local_b8);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x175c35e);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x175c36b);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}